

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.cpp
# Opt level: O0

SNMP_ERROR_STATUS __thiscall
OpaqueCallback::setTypeWithValue(OpaqueCallback *this,BER_CONTAINER *rawValue)

{
  OpaqueType *val;
  BER_CONTAINER *rawValue_local;
  OpaqueCallback *this_local;
  
  if (this->value == (uint8_t *)0x0) {
    this_local._4_4_ = GEN_ERR;
  }
  else if (rawValue[1]._vptr_BER_CONTAINER == (_func_int **)0x0) {
    this_local._4_4_ = WRONG_VALUE;
  }
  else if (this->data_len < (int)rawValue[1]._type) {
    this_local._4_4_ = WRONG_LENGTH;
  }
  else {
    memcpy(this->value,rawValue[1]._vptr_BER_CONTAINER,(long)this->data_len);
    this_local._4_4_ = NO_ERROR;
  }
  return this_local._4_4_;
}

Assistant:

SNMP_ERROR_STATUS OpaqueCallback::setTypeWithValue(BER_CONTAINER* rawValue){
    ASSERT_CALLBACK_SETTABLE();
    ASSERT_VALID_SETTABLE_VALUE(this->value);

    OpaqueType* val = static_cast<OpaqueType*>(rawValue);
    ASSERT_VALID_SETTING_VALUE(val->_value);
    if(val->_dataLength > this->data_len) return WRONG_LENGTH;
    memcpy(this->value, val->_value, this->data_len);

    return NO_ERROR;
}